

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_retention.pb.cc
# Opt level: O0

void proto2_unittest::TopLevelMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  TopLevelMessage **v1;
  TopLevelMessage **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  uint32_t *puVar5;
  anon_union_56_1_493b367e_for_TopLevelMessage_10 *this;
  TopLevelMessage *extendee;
  bool oneof_needs_init;
  uint32_t oneof_to_case;
  uint32_t oneof_from_case;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  TopLevelMessage *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TopLevelMessage *from;
  TopLevelMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (TopLevelMessage *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TopLevelMessage *)to_msg;
  _this = (TopLevelMessage *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TopLevelMessage_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::TopLevelMessage*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TopLevelMessage_const*,proto2_unittest::TopLevelMessage*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x28),0);
    uVar1 = *puVar5;
    if ((uVar1 & 1) != 0) {
      (from->field_0)._impl_.f_ = *(float *)(absl_log_internal_check_op_result + 0x30);
    }
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar5 = uVar1 | *puVar5;
    uVar2 = *(uint32_t *)(absl_log_internal_check_op_result + 0x40);
    if (uVar2 != 0) {
      uVar3 = (from->field_0)._impl_._oneof_case_[0];
      if (uVar3 != uVar2) {
        if (uVar3 != 0) {
          clear_o(from);
        }
        (from->field_0)._impl_._oneof_case_[0] = uVar2;
      }
      if ((uVar2 != 0) && (uVar2 == 2)) {
        (from->field_0)._impl_.o_ = *(OUnion *)(absl_log_internal_check_op_result + 0x38);
      }
    }
    this = &from->field_0;
    extendee = default_instance();
    google::protobuf::internal::ExtensionSet::MergeFrom
              (&(this->_impl_)._extensions_,(MessageLite *)extendee,
               (ExtensionSet *)(absl_log_internal_check_op_result + 0x10));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_retention.pb.cc"
             ,0x48e,failure_msg);
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void TopLevelMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TopLevelMessage*>(&to_msg);
  auto& from = static_cast<const TopLevelMessage&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TopLevelMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_impl_.f_ = from._impl_.f_;
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_o();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kI: {
        _this->_impl_.o_.i_ = from._impl_.o_.i_;
        break;
      }
      case O_NOT_SET:
        break;
    }
  }
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}